

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int EmitFancyRGB(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  WebPUpsampleLinePairFunc p_Var4;
  uint8_t *__src;
  uint8_t *__src_00;
  int iVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint8_t *puVar8;
  long lVar9;
  size_t __n;
  int local_64;
  
  iVar1 = io->mb_h;
  pWVar3 = p->output;
  iVar5 = io->mb_y;
  lVar9 = (long)(pWVar3->u).RGBA.stride;
  puVar6 = (pWVar3->u).RGBA.rgba + lVar9 * iVar5;
  iVar2 = io->mb_w;
  p_Var4 = WebPUpsamplers[pWVar3->colorspace];
  puVar8 = io->y;
  __src_00 = io->u;
  __src = io->v;
  if ((long)iVar5 == 0) {
    (*p_Var4)(puVar8,(uint8_t *)0x0,__src_00,__src,__src_00,__src,puVar6,(uint8_t *)0x0,iVar2);
    local_64 = iVar1;
  }
  else {
    (*p_Var4)(p->tmp_y,puVar8,p->tmp_u,p->tmp_v,__src_00,__src,puVar6 + -lVar9,puVar6,iVar2);
    local_64 = iVar1 + 1;
  }
  uVar7 = iVar1 + iVar5;
  while (iVar5 = iVar5 + 2, iVar5 < (int)uVar7) {
    iVar1 = io->uv_stride;
    lVar9 = (long)(pWVar3->u).RGBA.stride;
    puVar6 = puVar6 + lVar9 * 2;
    puVar8 = puVar8 + (long)io->y_stride * 2;
    (*p_Var4)(puVar8 + -(long)io->y_stride,puVar8,__src_00,__src,__src_00 + iVar1,__src + iVar1,
              puVar6 + -lVar9,puVar6,iVar2);
    __src = __src + iVar1;
    __src_00 = __src_00 + iVar1;
  }
  if ((int)(io->crop_top + uVar7) < io->crop_bottom) {
    memcpy(p->tmp_y,puVar8 + io->y_stride,(long)iVar2);
    __n = (size_t)((iVar2 + 1) / 2);
    memcpy(p->tmp_u,__src_00,__n);
    memcpy(p->tmp_v,__src,__n);
    local_64 = local_64 + -1;
  }
  else if ((uVar7 & 1) == 0) {
    (*p_Var4)(puVar8 + io->y_stride,(uint8_t *)0x0,__src_00,__src,__src_00,__src,
              puVar6 + (pWVar3->u).RGBA.stride,(uint8_t *)0x0,iVar2);
  }
  return local_64;
}

Assistant:

static int EmitFancyRGB(const VP8Io* const io, WebPDecParams* const p) {
  int num_lines_out = io->mb_h;   // a priori guess
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* dst = buf->rgba + (ptrdiff_t)io->mb_y * buf->stride;
  WebPUpsampleLinePairFunc upsample = WebPUpsamplers[p->output->colorspace];
  const uint8_t* cur_y = io->y;
  const uint8_t* cur_u = io->u;
  const uint8_t* cur_v = io->v;
  const uint8_t* top_u = p->tmp_u;
  const uint8_t* top_v = p->tmp_v;
  int y = io->mb_y;
  const int y_end = io->mb_y + io->mb_h;
  const int mb_w = io->mb_w;
  const int uv_w = (mb_w + 1) / 2;

  if (y == 0) {
    // First line is special cased. We mirror the u/v samples at boundary.
    upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, mb_w);
  } else {
    // We can finish the left-over line from previous call.
    upsample(p->tmp_y, cur_y, top_u, top_v, cur_u, cur_v,
             dst - buf->stride, dst, mb_w);
    ++num_lines_out;
  }
  // Loop over each output pairs of row.
  for (; y + 2 < y_end; y += 2) {
    top_u = cur_u;
    top_v = cur_v;
    cur_u += io->uv_stride;
    cur_v += io->uv_stride;
    dst += 2 * buf->stride;
    cur_y += 2 * io->y_stride;
    upsample(cur_y - io->y_stride, cur_y,
             top_u, top_v, cur_u, cur_v,
             dst - buf->stride, dst, mb_w);
  }
  // move to last row
  cur_y += io->y_stride;
  if (io->crop_top + y_end < io->crop_bottom) {
    // Save the unfinished samples for next call (as we're not done yet).
    memcpy(p->tmp_y, cur_y, mb_w * sizeof(*p->tmp_y));
    memcpy(p->tmp_u, cur_u, uv_w * sizeof(*p->tmp_u));
    memcpy(p->tmp_v, cur_v, uv_w * sizeof(*p->tmp_v));
    // The fancy upsampler leaves a row unfinished behind
    // (except for the very last row)
    num_lines_out--;
  } else {
    // Process the very last row of even-sized picture
    if (!(y_end & 1)) {
      upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v,
               dst + buf->stride, NULL, mb_w);
    }
  }
  return num_lines_out;
}